

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameWithClusterInfo.cpp
# Opt level: O1

void __thiscall
BayesianGameWithClusterInfo::~BayesianGameWithClusterInfo(BayesianGameWithClusterInfo *this)

{
  ~BayesianGameWithClusterInfo(this);
  operator_delete(this,0x1c8);
  return;
}

Assistant:

BayesianGameWithClusterInfo::~BayesianGameWithClusterInfo()
{
    //free all the type information:
    std::vector< TypeClusterList* >::iterator it1 =  _m_typeLists.begin();
    std::vector< TypeClusterList* >::iterator last1 =  _m_typeLists.end();
    while(it1 != last1)
    {
        TypeClusterList* aohl = *it1;
        //TypeClusterList defined as std::vector<TypeCluster* > 
         std::vector<TypeCluster* >::iterator it2 = aohl->begin();
         std::vector<TypeCluster* >::iterator last2 = aohl->end();
         while(it2 != last2)
         {
             delete *it2;
             it2++;
         }            
        delete aohl;
        it1++;
    }
}